

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_Test::testBody
          (TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  char *pcVar6;
  char *pcVar7;
  SimpleString local_70;
  SimpleString local_60;
  int retval2;
  int retval1;
  int param2;
  int param1;
  SimpleString local_40;
  SimpleString local_30;
  
  param2 = 1;
  retval1 = 2;
  retval2 = 3;
  param1 = param2;
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_70);
  SimpleString::SimpleString(&local_30,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_30,&retval1,4);
  SimpleString::SimpleString(&local_40,"foobar");
  (**(code **)(*plVar3 + 0x30))(plVar3,&local_40,&retval2,4);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_70);
  SimpleString::SimpleString(&local_30,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_30,&param1);
  SimpleString::SimpleString(&local_40,"foobar");
  (**(code **)(*plVar3 + 0x28))(plVar3,&local_40,&param2);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  iVar1 = retval1;
  pUVar4 = UtestShell::getCurrent();
  if (iVar1 == 2) {
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2f8,pTVar5);
  }
  else {
    ::StringFrom((int)&local_60);
    pcVar6 = SimpleString::asCharString(&local_60);
    ::StringFrom((int)&local_70);
    pcVar7 = SimpleString::asCharString(&local_70);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2f8,pTVar5);
    SimpleString::~SimpleString(&local_70);
    SimpleString::~SimpleString(&local_60);
  }
  iVar1 = param1;
  pUVar4 = UtestShell::getCurrent();
  if (iVar1 == 2) {
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2f9,pTVar5);
  }
  else {
    ::StringFrom((int)&local_60);
    pcVar6 = SimpleString::asCharString(&local_60);
    ::StringFrom((int)&local_70);
    pcVar7 = SimpleString::asCharString(&local_70);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2f9,pTVar5);
    SimpleString::~SimpleString(&local_70);
    SimpleString::~SimpleString(&local_60);
  }
  iVar1 = retval2;
  pUVar4 = UtestShell::getCurrent();
  if (iVar1 == 3) {
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2fa,pTVar5);
  }
  else {
    ::StringFrom((int)&local_60);
    pcVar6 = SimpleString::asCharString(&local_60);
    ::StringFrom((int)&local_70);
    pcVar7 = SimpleString::asCharString(&local_70);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2fa,pTVar5);
    SimpleString::~SimpleString(&local_70);
    SimpleString::~SimpleString(&local_60);
  }
  iVar1 = param2;
  pUVar4 = UtestShell::getCurrent();
  if (iVar1 == 3) {
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2fb,pTVar5);
  }
  else {
    ::StringFrom((int)&local_60);
    pcVar6 = SimpleString::asCharString(&local_60);
    ::StringFrom((int)&local_70);
    pcVar7 = SimpleString::asCharString(&local_70);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2fb,pTVar5);
    SimpleString::~SimpleString(&local_70);
    SimpleString::~SimpleString(&local_60);
  }
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_60);
  return;
}

Assistant:

TEST(MockParameterTest, twoDifferentOutputParametersInSameFunctionCallSucceeds)
{
    int param1 = 1;
    int param2 = 1;
    int retval1 = 2;
    int retval2 = 3;

    mock().expectOneCall("foo")
        .withOutputParameterReturning("bar", &retval1, sizeof(retval1))
        .withOutputParameterReturning("foobar", &retval2, sizeof(retval2));
    mock().actualCall("foo")
        .withOutputParameter("bar", &param1)
        .withOutputParameter("foobar", &param2);

    CHECK_EQUAL(2, retval1);
    CHECK_EQUAL(2, param1);
    CHECK_EQUAL(3, retval2);
    CHECK_EQUAL(3, param2);
    mock().checkExpectations();
}